

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O0

LoggerId __thiscall
zsummer::log4z::CLogerManager::CreateLogger
          (CLogerManager *this,char *name,char *path,int nLevel,bool display,bool monthdir,
          uint limitsize)

{
  bool bVar1;
  size_t sVar2;
  pointer ppVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  int iVar6;
  allocator<char> local_101;
  key_type local_100;
  _Self local_e0;
  allocator<char> local_d1;
  key_type local_d0;
  _Self local_b0;
  iterator iter;
  LoggerId newID;
  string fullpath;
  undefined1 local_70 [8];
  string _pid;
  string _tmp;
  bool monthdir_local;
  bool display_local;
  int nLevel_local;
  char *path_local;
  char *name_local;
  CLogerManager *this_local;
  
  std::__cxx11::string::string((string *)(_pid.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_70);
  GetProcessInfo((string *)(_pid.field_2._M_local_buf + 8),(string *)local_70);
  sVar2 = strlen(name);
  if (sVar2 == 0) {
    ShowColorText("log4z: create logger error, name is empty ! \r\n",5);
    this_local._4_4_ = -1;
    fullpath.field_2._8_4_ = 1;
    goto LAB_00122f71;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&newID,path,(allocator<char> *)((long)&iter._M_node + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&iter._M_node + 7));
  TrimLogConfig((string *)&newID,'\0');
  FixPath((string *)&newID);
  iter._M_node._0_4_ = -1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,name,&local_d1);
  local_b0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(&this->m_ids,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  local_e0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end(&this->m_ids);
  bVar1 = std::operator!=(&local_b0,&local_e0);
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->(&local_b0);
    iter._M_node._0_4_ = ppVar3->second;
  }
  if ((int)iter._M_node == -1) {
    if (this->m_lastId + 1 < 10) {
      iVar6 = this->m_lastId + 1;
      this->m_lastId = iVar6;
      iter._M_node._0_4_ = iVar6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,name,&local_101);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&this->m_ids,&local_100);
      *pmVar4 = iVar6;
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator(&local_101);
      goto LAB_00122dca;
    }
    ShowColorText("log4z: CreateLogger can not create|writeover, because loggerid need < LOGGER_MAX! \r\n"
                  ,5);
    this_local._4_4_ = -1;
  }
  else {
LAB_00122dca:
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)&this->m_loggers[(int)iter._M_node]._path,(string *)&newID);
    }
    if (0 < (int)iter._M_node) {
      std::__cxx11::string::operator=((string *)(this->m_loggers + (int)iter._M_node),name);
    }
    std::__cxx11::string::operator=
              ((string *)&this->m_loggers[(int)iter._M_node]._pid,(string *)local_70);
    this->m_loggers[(int)iter._M_node]._level = nLevel;
    this->m_loggers[(int)iter._M_node]._enable = true;
    this->m_loggers[(int)iter._M_node]._display = display;
    this->m_loggers[(int)iter._M_node]._monthdir = monthdir;
    this->m_loggers[(int)iter._M_node]._limitsize = limitsize;
    if (limitsize == 0) {
      this->m_loggers[(int)iter._M_node]._limitsize = 4000;
    }
    this_local._4_4_ = (int)iter._M_node;
  }
  fullpath.field_2._8_4_ = 1;
  std::__cxx11::string::~string((string *)&newID);
LAB_00122f71:
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(_pid.field_2._M_local_buf + 8));
  return this_local._4_4_;
}

Assistant:

virtual LoggerId CreateLogger(const char* name,const char* path,int nLevel,bool display, bool monthdir, unsigned int limitsize)
	{
		std::string _tmp;
		std::string _pid;
		GetProcessInfo(_tmp, _pid);
		if (strlen(name) == 0)
		{
			ShowColorText("log4z: create logger error, name is empty ! \r\n", LOG_LEVEL_FATAL);
			return -1;
		}
		std::string fullpath = path;
		TrimLogConfig(fullpath);
		FixPath(fullpath);

		LoggerId newID = -1;
		{
			std::map<std::string, LoggerId>::iterator iter = m_ids.find(name);
			if (iter != m_ids.end())
			{
				newID = iter->second;
			}
		}
		if (newID == -1)
		{
			if (m_lastId +1 >= LOG4Z_LOGGER_MAX)
			{
				ShowColorText("log4z: CreateLogger can not create|writeover, because loggerid need < LOGGER_MAX! \r\n", LOG_LEVEL_FATAL);
				return -1;
			}
			newID = ++ m_lastId;
			m_ids[name] = newID;
		}

		if (!fullpath.empty())
		{
			m_loggers[newID]._path = fullpath;
		}

		if (newID > LOG4Z_MAIN_LOGGER_ID)
		{
			m_loggers[newID]._name = name;
		}
		m_loggers[newID]._pid = _pid;
		m_loggers[newID]._level = nLevel;
		m_loggers[newID]._enable = true;
		m_loggers[newID]._display = display;
		m_loggers[newID]._monthdir = monthdir;
		m_loggers[newID]._limitsize = limitsize;
		if (limitsize == 0)
		{
			m_loggers[newID]._limitsize = 4000;
		}

		return newID;
	}